

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CESkyCoord.cpp
# Opt level: O0

void CESkyCoord::ICRS2Observed
               (CESkyCoord *in_icrs,CESkyCoord *out_observed,CEDate *date,CEObserver *observer,
               CESkyCoord *observed_icrs,CEAngle *hour_angle)

{
  long in_R8;
  CESkyCoord obs_cirs;
  CESkyCoord tmp_cirs;
  CEAngle *in_stack_000001f8;
  CESkyCoord *in_stack_00000200;
  CEObserver *in_stack_00000208;
  CEDate *in_stack_00000210;
  CESkyCoord *in_stack_00000218;
  CESkyCoord *in_stack_00000220;
  CESkyCoord *in_stack_ffffffffffffff60;
  CESkyCoord *in_stack_ffffffffffffff80;
  
  CESkyCoord(in_stack_ffffffffffffff80);
  ICRS2CIRS(in_icrs,out_observed,date);
  CESkyCoord(in_stack_ffffffffffffff80);
  CIRS2Observed(in_stack_00000220,in_stack_00000218,in_stack_00000210,in_stack_00000208,
                in_stack_00000200,in_stack_000001f8);
  if (in_R8 != 0) {
    CIRS2ICRS(in_icrs,out_observed,date);
  }
  ~CESkyCoord(in_stack_ffffffffffffff60);
  ~CESkyCoord(in_stack_ffffffffffffff60);
  return;
}

Assistant:

void CESkyCoord::ICRS2Observed(const CESkyCoord& in_icrs,
                               CESkyCoord*       out_observed,
                               const CEDate&     date,
                               const CEObserver& observer,
                               CESkyCoord*       observed_icrs,
                               CEAngle*          hour_angle)
{
    // First convert the ICRS coordinates to CIRS coordinates
    CESkyCoord tmp_cirs;
    ICRS2CIRS(in_icrs, &tmp_cirs, date);

    // Now convert CIRS to Observed
    CESkyCoord obs_cirs;
    CIRS2Observed(tmp_cirs, out_observed,
                  date, observer, 
                  &obs_cirs, hour_angle);
    
    // Convert the apparent CIRS RA,Dec to ICRS RA,Dec
    if (observed_icrs != nullptr) {
        CIRS2ICRS(obs_cirs, observed_icrs, date);
    }

    return;
}